

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O1

void __thiscall
Js::SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
          (SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *this,
          void *src,uint *dst)

{
  ScriptContext *scriptContext;
  SerializationCloner<Js::StreamWriter> *pSVar1;
  Var pvVar2;
  bool bVar3;
  SrcTypeId typeId;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  Src local_38;
  Var local_30;
  void *src_local;
  SCADeepCloneType deepClone;
  
  scriptContext =
       (this->m_cloner->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  local_30 = src;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  pvVar2 = local_30;
  if (local_30 != (Var)0x0) {
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(local_30);
    if (bVar3) {
      this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar2);
    }
    else {
      this_00 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
  }
  typeId = SerializationCloner<Js::StreamWriter>::GetTypeId(this->m_cloner,local_30);
  bVar3 = SerializationCloner<Js::StreamWriter>::TryClonePrimitive
                    (this->m_cloner,typeId,local_30,dst);
  if (bVar3) {
    return;
  }
  local_38 = local_30;
  bVar3 = JsUtil::
          BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->m_clonedObjects,&local_38,dst);
  if (bVar3) {
    pSVar1 = this->m_cloner;
    src_local._4_4_ = *dst;
    local_38 = (Src)CONCAT44(local_38._4_4_,1);
    StreamWriter::Write<unsigned_int>(pSVar1->m_writer,(uint *)&local_38);
    StreamWriter::Write<unsigned_int>(pSVar1->m_writer,(uint *)((long)&src_local + 4));
    return;
  }
  bVar3 = SerializationCloner<Js::StreamWriter>::TryCloneObject
                    (this->m_cloner,typeId,local_30,dst,(SCADeepCloneType *)((long)&src_local + 4));
  if (!bVar3) {
    ScriptContextHolder::ThrowSCAUnsupported((ScriptContextHolder *)this->m_cloner);
  }
  JsUtil::
  BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this->m_clonedObjects,&local_30,dst);
  if (src_local._4_4_ == 3) {
    SerializationCloner<Js::StreamWriter>::CloneSet(this->m_cloner,local_30,*dst);
  }
  else {
    if (src_local._4_4_ != 2) goto LAB_00f229b7;
    SerializationCloner<Js::StreamWriter>::CloneMap(this->m_cloner,local_30,*dst);
  }
  src_local._4_4_ = 1;
LAB_00f229b7:
  pvVar2 = local_30;
  if (src_local._4_4_ == 1) {
    SerializationCloner<Js::StreamWriter>::CloneProperties(this->m_cloner,typeId,local_30,*dst);
  }
  else if (src_local._4_4_ == 4) {
    pSVar1 = this->m_cloner;
    local_38 = (Src)CONCAT44(local_38._4_4_,100);
    StreamWriter::Write<unsigned_int>(pSVar1->m_writer,(uint *)&local_38);
    StreamWriter::WriteHostObject(pSVar1->m_writer,pvVar2);
  }
  return;
}

Assistant:

void Clone(Src src, Dst* dst)
        {
            PROBE_STACK(m_cloner->GetScriptContext(), Constants::MinStackDefault);

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Src>(src);
#endif

            typename Cloner::SrcTypeId typeId = m_cloner->GetTypeId(src);

            if (m_cloner->TryClonePrimitive(typeId, src, dst))
            {
                return;
            }

            if (Cloner::ShouldLookupReference() && TryGetClonedObject(src, dst))
            {
                m_cloner->CloneObjectReference(src, *dst);
                return;
            }

            SCADeepCloneType deepClone;
            if (m_cloner->TryCloneObject(typeId, src, dst, &deepClone))
            {
                m_clonedObjects->Add(src, *dst);

                if (deepClone == SCADeepCloneType::Map)
                {
                    m_cloner->CloneMap(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }
                else if (deepClone == SCADeepCloneType::Set)
                {
                    m_cloner->CloneSet(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }

                if (deepClone == SCADeepCloneType::HostObject)
                {
                    m_cloner->CloneHostObjectProperties(typeId, src, *dst);
                }
                else if (deepClone == SCADeepCloneType::Object)
                {
                    m_cloner->CloneProperties(typeId, src, *dst);
                }
                return;
            }

            // Unsupported src type, throw
            m_cloner->ThrowSCAUnsupported();
        }